

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeFrom
          (MessageGenerator *this,Printer *printer)

{
  pointer *pppFVar1;
  FieldGeneratorMap *this_00;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  FieldDescriptor FVar2;
  Descriptor *pDVar3;
  pointer ppFVar4;
  FieldDescriptor *pFVar5;
  iterator __position;
  pointer piVar6;
  long lVar7;
  long *plVar8;
  iterator __position_00;
  MessageGenerator *this_01;
  undefined8 uVar9;
  bool bVar10;
  FileOptions_OptimizeMode FVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  LogMessage *pLVar15;
  FieldGenerator *pFVar16;
  FieldDescriptor *pFVar17;
  AnnotationCollector *pAVar18;
  ulong uVar19;
  long lVar20;
  uint32_t uVar21;
  AnnotationCollector *pAVar22;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  size_t sVar23;
  byte bVar24;
  uint uVar25;
  pointer ppFVar26;
  byte bVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer this_02;
  int iVar29;
  Options *pOVar30;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Hex hex;
  Hex hex_00;
  int cached_has_word_index;
  string chunk_mask_str;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  Formatter format;
  Iterator __begin4;
  Iterator __end4;
  Iterator __end3;
  ColdChunkSkipper cold_skipper;
  int local_2cc;
  MessageGenerator *local_2c8;
  Printer *local_2c0;
  undefined4 local_2b4;
  Options *local_2b0;
  uint local_2a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  undefined1 local_280 [16];
  undefined1 local_270 [48];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Formatter local_228;
  pointer local_1f0;
  int local_1e4;
  pointer local_1e0;
  AnnotationCollector *local_1d8;
  Iterator local_1d0;
  Iterator local_1c0;
  Iterator local_1b0;
  ColdChunkSkipper local_1a0;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pDVar3 = this->descriptor_;
  local_2c8 = this;
  local_2c0 = printer;
  FVar11 = GetOptimizeFor(*(FileDescriptor **)(pDVar3 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar11 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar3 + 0x78) != 0)) ||
     (*(int *)(pDVar3 + 4) != 0)) {
    local_228.printer_ = local_2c0;
    local_2b0 = &this->options_;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_228.vars_._M_t,&(local_2c8->variables_)._M_t);
    Formatter::operator()<>
              (&local_228,
               "void $classname$::MergeFrom(const $classname$& from) {\n$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n  $DCHK$_NE(&from, this);\n"
              );
    io::Printer::Indent(local_228.printer_);
    Formatter::operator()<>(&local_228,"$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n")
    ;
    this_01 = local_2c8;
    uVar31 = 0;
    uVar32 = 0;
    local_270._40_8_ =
         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *)0x0;
    pvStack_240 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)0x0;
    local_238._M_allocated_capacity = 0;
    ppFVar4 = (local_2c8->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __position_00._M_current = pvStack_240;
    for (ppFVar26 = (local_2c8->optimized_order_).
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        pvStack_240 = __position_00._M_current, ppFVar26 != ppFVar4; ppFVar26 = ppFVar26 + 1) {
      pFVar5 = *ppFVar26;
      local_1a0.chunks_ =
           (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            *)pFVar5;
      if ((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           *)local_270._40_8_ == __position_00._M_current) {
LAB_002abb72:
        if (__position_00._M_current ==
            (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_238._M_allocated_capacity) {
          std::
          vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ::_M_realloc_insert<>
                    ((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                      *)(local_270 + 0x28),__position_00);
          uVar31 = extraout_XMM0_Da_00;
          uVar32 = extraout_XMM0_Db_00;
        }
        else {
          uVar31 = 0;
          uVar32 = 0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ((__position_00._M_current)->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pvStack_240 = pvStack_240 + 1;
        }
      }
      else {
        iVar12 = HasBitIndex(this_01,__position_00._M_current[-1].
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish[-1]);
        iVar29 = iVar12 + 7;
        if (-1 < iVar12) {
          iVar29 = iVar12;
        }
        iVar29 = iVar29 >> 3;
        if (iVar12 == -1) {
          iVar29 = -1;
        }
        iVar13 = HasBitIndex(this_01,pFVar5);
        iVar12 = iVar13 + 7;
        if (-1 < iVar13) {
          iVar12 = iVar13;
        }
        iVar12 = iVar12 >> 3;
        if (iVar13 == -1) {
          iVar12 = -1;
        }
        uVar31 = extraout_XMM0_Da;
        uVar32 = extraout_XMM0_Db;
        if (iVar29 != iVar12) goto LAB_002abb72;
      }
      __position._M_current =
           pvStack_240[-1].
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          pvStack_240[-1].
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)(pvStack_240 + -1),__position,(FieldDescriptor **)&local_1a0);
        uVar31 = extraout_XMM0_Da_01;
        uVar32 = extraout_XMM0_Db_01;
      }
      else {
        *__position._M_current = (FieldDescriptor *)local_1a0.chunks_;
        pppFVar1 = &pvStack_240[-1].
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppFVar1 = *pppFVar1 + 1;
      }
      __position_00._M_current = pvStack_240;
    }
    local_1e0 = (pointer)&local_2c8->has_bit_indices_;
    anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
              (&local_1a0,local_2b0,
               (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                *)(local_270 + 0x28),(vector<int,_std::allocator<int>_> *)local_1e0,
               (double)CONCAT44(uVar32,uVar31));
    local_2cc = -1;
    if (pvStack_240 !=
        (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         *)local_270._40_8_) {
      local_1f0 = (pointer)&local_2c8->field_generators_;
      pAVar22 = (AnnotationCollector *)0x0;
      do {
        uVar9 = local_270._40_8_;
        paVar28 = &local_2a0.field_2;
        local_1d8 = pAVar22;
        if ((ulong)(*(long *)(local_270._40_8_ + (long)pAVar22 * 0x18 + 8) -
                   (long)*(undefined8 **)(local_270._40_8_ + (long)pAVar22 * 0x18)) < 9) {
          local_2b4 = 0;
        }
        else {
          iVar29 = HasBitIndex(local_2c8,
                               (FieldDescriptor *)
                               **(undefined8 **)(local_270._40_8_ + (long)pAVar22 * 0x18));
          local_2b4 = CONCAT31((int3)(iVar29 + 7U >> 8),iVar29 + 7U < 0xfffffff8 && iVar29 != -1);
        }
        local_2a0._M_dataplus._M_p = (pointer)paVar28;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"from.","");
        local_280._0_8_ = local_2c0;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)(local_280 + 8),&local_1a0.variables_._M_t);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_280 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != paVar28) {
          operator_delete(local_2a0._M_dataplus._M_p);
        }
        fields = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)(uVar9 + (long)pAVar22 * 0x18);
        if ((char)local_2b4 != '\0') {
          uVar14 = anon_unknown_0::GenChunkMask
                             (fields,(vector<int,_std::allocator<int>_> *)local_1e0);
          hex.value = (ulong)uVar14;
          hex._8_8_ = 8;
          strings::AlphaNum::AlphaNum((AlphaNum *)local_280,hex);
          local_2a0._M_dataplus._M_p = (pointer)paVar28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2a0,local_280._0_8_,
                     (pointer)(local_280._0_8_ + local_280._8_8_));
          if (uVar14 == 0) {
            bVar10 = true;
          }
          else {
            iVar29 = 0;
            uVar21 = uVar14;
            do {
              iVar29 = iVar29 + (uVar21 & 1);
              bVar10 = 1 < uVar21;
              uVar21 = uVar21 >> 1;
            } while (bVar10);
            bVar10 = iVar29 < 2;
          }
          if (bVar10) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe21);
            pLVar15 = internal::LogMessage::operator<<
                                (&local_68,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
            internal::LogMessage::~LogMessage(&local_68);
          }
          uVar25 = 0;
          if (uVar14 != 0) {
            do {
              uVar25 = uVar25 + (uVar14 & 1);
              bVar10 = 1 < uVar14;
              uVar14 = uVar14 >> 1;
            } while (bVar10);
            uVar25 = (uint)(8 < (int)uVar25);
          }
          if ((char)uVar25 != '\0') {
            internal::LogMessage::LogMessage
                      (&local_110,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                       ,0xe22);
            pLVar15 = internal::LogMessage::operator<<
                                (&local_110,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
            internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
            internal::LogMessage::~LogMessage(&local_110);
          }
          iVar12 = local_2cc;
          iVar13 = HasBitIndex(local_2c8,
                               *(fields->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          iVar29 = iVar13 + 0x1f;
          if (-1 < iVar13) {
            iVar29 = iVar13;
          }
          iVar29 = iVar29 >> 5;
          if (iVar13 == -1) {
            iVar29 = -1;
          }
          if (iVar12 != iVar29) {
            local_2cc = iVar29;
            Formatter::operator()(&local_228,"cached_has_bits = from._has_bits_[$1$];\n",&local_2cc)
            ;
          }
          Formatter::operator()(&local_228,"if (cached_has_bits & 0x$1$u) {\n",&local_2a0);
          io::Printer::Indent(local_228.printer_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != paVar28) {
            operator_delete(local_2a0._M_dataplus._M_p);
          }
        }
        pOVar30 = (Options *)
                  (fields->
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_2b0 = (Options *)
                    (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        if (pOVar30 == local_2b0) {
          uVar14 = 0;
        }
        else {
          local_2a4 = 0;
          this_02 = local_1f0;
          do {
            pFVar5 = (FieldDescriptor *)(pOVar30->dllexport_decl)._M_dataplus._M_p;
            pFVar16 = FieldGeneratorMap::get((FieldGeneratorMap *)this_02,pFVar5);
            FVar2 = pFVar5[1];
            bVar24 = (byte)FVar2 & 0x60;
            if (bVar24 == 0x60) {
              (*pFVar16->_vptr_FieldGenerator[0xc])(pFVar16,local_2c0);
            }
            else if ((bVar24 == 0x20) &&
                    (((((byte)FVar2 & 2) == 0 &&
                      ((*(char *)(*(long *)(pFVar5 + 0x10) + 0x3a) != '\x02' ||
                       ((((byte)FVar2 & 0x10) != 0 && (*(long *)(pFVar5 + 0x28) != 0)))))) ||
                     (*(char *)(*(long *)(pFVar5 + 0x38) + 0x4f) == '\x01')))) {
              local_280._0_8_ = local_270;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"from.","");
              bVar10 = anon_unknown_0::EmitFieldNonDefaultCondition
                                 (local_2c0,(string *)local_280,pFVar5);
              if ((Printer *)local_280._0_8_ != (Printer *)local_270) {
                operator_delete((void *)local_280._0_8_);
              }
              (*pFVar16->_vptr_FieldGenerator[0xc])(pFVar16,local_2c0);
              if (bVar10) {
                io::Printer::Outdent(local_228.printer_);
                Formatter::operator()<>(&local_228,"}\n");
              }
            }
            else {
              bVar27 = *(byte *)(*(long *)(pFVar5 + 0x38) + 0x4f);
              pFVar17 = extraout_RDX;
              if (bVar27 == 0) {
                local_1e4 = local_2cc;
                iVar12 = HasBitIndex(local_2c8,pFVar5);
                iVar29 = iVar12 + 0x1f;
                if (-1 < iVar12) {
                  iVar29 = iVar12;
                }
                iVar29 = iVar29 >> 5;
                if (iVar12 == -1) {
                  iVar29 = -1;
                }
                pFVar17 = extraout_RDX_00;
                if (local_1e4 == iVar29) {
                  if (((byte)FVar2 & 2) == 0) {
                    if ((bVar24 == 0x20) && (*(char *)(*(long *)(pFVar5 + 0x10) + 0x3a) == '\x02'))
                    {
                      if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(pFVar5 + 0x28) == 0))
                      goto LAB_002ac12f;
                    }
                    else if (bVar24 == 0x40) goto LAB_002ac12f;
                    bVar10 = false;
                  }
                  else {
LAB_002ac12f:
                    bVar10 = true;
                  }
                  if (!bVar10) {
                    internal::LogMessage::LogMessage
                              (&local_148,LOGLEVEL_DFATAL,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                               ,0xe4a);
                    pLVar15 = internal::LogMessage::operator<<
                                        (&local_148,"CHECK failed: HasHasbit(field): ");
                    internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
                    internal::LogMessage::~LogMessage(&local_148);
                  }
                  if (((byte)pFVar5[1] & 8) == 0) {
                    pFVar17 = pFVar5 + 0x20;
                    uVar19 = 0x28;
                  }
                  else {
                    pFVar17 = pFVar5 + 0x28;
                    if (*(long *)(pFVar5 + 0x28) == 0) {
                      pFVar17 = pFVar5 + 0x10;
                    }
                    uVar19 = (ulong)(*(long *)(pFVar5 + 0x28) == 0) << 5 | 0x50;
                  }
                  piVar6 = (((_Vector_base<int,_std::allocator<int>_> *)&local_1e0->_M_dataplus)->
                           _M_impl).super__Vector_impl_data._M_start;
                  uVar19 = CONCAT71((int7)((ulong)piVar6 >> 8),
                                    (char)piVar6[(int)((ulong)((long)pFVar5 -
                                                              *(long *)(*(long *)pFVar17 + uVar19))
                                                      >> 3) * 0x38e38e39]) & 0xffffffffffffff1f;
                  hex_00.value = 1L << (sbyte)uVar19;
                  hex_00._8_8_ = 8;
                  strings::AlphaNum::AlphaNum((AlphaNum *)local_280,hex_00);
                  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2a0,local_280._0_8_,
                             (pointer)(local_280._0_8_ + local_280._8_8_));
                  Formatter::operator()(&local_228,"if (cached_has_bits & 0x$1$u) {\n",&local_2a0);
                  io::Printer::Indent(local_228.printer_);
                  if (((char)local_2b4 == '\0') || (bVar10 = anon_unknown_0::IsPOD(pFVar5), !bVar10)
                     ) {
                    (*pFVar16->_vptr_FieldGenerator[0xc])(pFVar16,local_2c0);
                  }
                  else {
                    local_2a4 = (uint)CONCAT71((int7)(uVar19 >> 8),1);
                    (*pFVar16->_vptr_FieldGenerator[0xd])(pFVar16,local_2c0);
                  }
                  io::Printer::Outdent(local_228.printer_);
                  Formatter::operator()<>(&local_228,"}\n");
                  this_02 = local_1f0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                    operator_delete(local_2a0._M_dataplus._M_p);
                    this_02 = local_1f0;
                  }
                  goto LAB_002ac2a8;
                }
              }
              if (((byte)FVar2 & 2) == 0) {
                if ((bVar24 == 0x20) && (*(char *)(*(long *)(pFVar5 + 0x10) + 0x3a) == '\x02')) {
                  if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(pFVar5 + 0x28) == 0))
                  goto LAB_002ac04e;
                }
                else if (bVar24 == 0x40) goto LAB_002ac04e;
                bVar27 = 0;
              }
              else {
LAB_002ac04e:
                bVar27 = bVar27 ^ 1;
              }
              if (bVar27 == 0) {
                internal::LogMessage::LogMessage
                          (&local_a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                           ,0xe42);
                pLVar15 = internal::LogMessage::operator<<
                                    (&local_a0,"CHECK failed: HasHasbit(field): ");
                internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
                internal::LogMessage::~LogMessage(&local_a0);
                pFVar17 = extraout_RDX_01;
              }
              FieldName_abi_cxx11_((string *)local_280,(cpp *)pFVar5,pFVar17);
              Formatter::operator()
                        (&local_228,"if (from._internal_has_$1$()) {\n",(string *)local_280);
              this_02 = local_1f0;
              if ((Printer *)local_280._0_8_ != (Printer *)local_270) {
                operator_delete((void *)local_280._0_8_);
              }
              io::Printer::Indent(local_228.printer_);
              (*pFVar16->_vptr_FieldGenerator[0xc])(pFVar16,local_2c0);
              io::Printer::Outdent(local_228.printer_);
              Formatter::operator()<>(&local_228,"}\n");
            }
LAB_002ac2a8:
            pOVar30 = (Options *)&(pOVar30->dllexport_decl)._M_string_length;
            uVar14 = local_2a4;
          } while (pOVar30 != local_2b0);
        }
        if ((char)local_2b4 != '\0') {
          if ((uVar14 & 1) != 0) {
            if (local_2cc < 0) {
              internal::LogMessage::LogMessage
                        (&local_d8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0xe62);
              pLVar15 = internal::LogMessage::operator<<
                                  (&local_d8,"CHECK failed: (0) <= (cached_has_word_index): ");
              internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
              internal::LogMessage::~LogMessage(&local_d8);
            }
            Formatter::operator()(&local_228,"_has_bits_[$1$] |= cached_has_bits;\n",&local_2cc);
          }
          io::Printer::Outdent(local_228.printer_);
          Formatter::operator()<>(&local_228,"}\n");
        }
        bVar10 = anon_unknown_0::ColdChunkSkipper::OnEndChunk(&local_1a0,(int)local_1d8,local_2c0);
        if (bVar10) {
          local_2cc = -1;
        }
        pAVar22 = (AnnotationCollector *)((long)&local_1d8->_vptr_AnnotationCollector + 1);
        pAVar18 = (AnnotationCollector *)
                  (((long)pvStack_240 - local_270._40_8_ >> 3) * -0x5555555555555555);
      } while (pAVar22 <= pAVar18 && (long)pAVar18 - (long)pAVar22 != 0);
    }
    local_2a0._M_string_length = (size_type)local_2c8->descriptor_;
    local_2a0._M_dataplus._M_p = local_2a0._M_dataplus._M_p & 0xffffffff00000000;
    local_1b0.idx = *(int *)(local_2a0._M_string_length + 0x6c);
    this_00 = &local_2c8->field_generators_;
    local_1b0.descriptor = (Descriptor *)local_2a0._M_string_length;
    while (bVar10 = operator==((Iterator *)&local_2a0,&local_1b0), !bVar10) {
      lVar20 = (long)(int)local_2a0._M_dataplus._M_p;
      lVar7 = *(long *)(local_2a0._M_string_length + 0x30);
      Formatter::operator()
                (&local_228,"switch (from.$1$_case()) {\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (lVar7 + 8 + lVar20 * 0x28));
      io::Printer::Indent(local_228.printer_);
      local_2b0 = (Options *)(lVar7 + lVar20 * 0x28);
      local_1d0.idx = 0;
      local_1c0.idx = *(int *)((long)&(local_2b0->dllexport_decl)._M_dataplus._M_p + 4);
      local_1d0.descriptor = (OneofDescriptor *)local_2b0;
      local_1c0.descriptor = (OneofDescriptor *)local_2b0;
      while (bVar10 = operator==(&local_1d0,&local_1c0), !bVar10) {
        lVar20 = (long)local_1d0.idx;
        lVar7 = *(long *)((long)local_1d0.descriptor + 0x20);
        UnderscoresToCamelCase((string *)local_280,*(string **)(lVar7 + lVar20 * 0x48 + 8),true);
        Formatter::operator()(&local_228,"case k$1$: {\n",(string *)local_280);
        if ((Printer *)local_280._0_8_ != (Printer *)local_270) {
          operator_delete((void *)local_280._0_8_);
        }
        io::Printer::Indent(local_228.printer_);
        pFVar16 = FieldGeneratorMap::get(this_00,(FieldDescriptor *)(lVar7 + lVar20 * 0x48));
        (*pFVar16->_vptr_FieldGenerator[0xc])(pFVar16,local_2c0);
        Formatter::operator()<>(&local_228,"break;\n");
        io::Printer::Outdent(local_228.printer_);
        Formatter::operator()<>(&local_228,"}\n");
        local_1d0.idx = local_1d0.idx + 1;
      }
      plVar8 = (long *)(local_2b0->dllexport_decl)._M_string_length;
      local_280._0_8_ = local_270;
      lVar7 = *plVar8;
      std::__cxx11::string::_M_construct<char*>((string *)local_280,lVar7,plVar8[1] + lVar7);
      if (local_280._8_8_ != 0) {
        sVar23 = 0;
        do {
          if ((byte)(*(char *)(local_280._0_8_ + sVar23) + 0x9fU) < 0x1a) {
            *(char *)(local_280._0_8_ + sVar23) = *(char *)(local_280._0_8_ + sVar23) + -0x20;
          }
          sVar23 = sVar23 + 1;
        } while (local_280._8_8_ != sVar23);
      }
      Formatter::operator()(&local_228,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)local_280);
      if ((Printer *)local_280._0_8_ != (Printer *)local_270) {
        operator_delete((void *)local_280._0_8_);
      }
      io::Printer::Outdent(local_228.printer_);
      Formatter::operator()<>(&local_228,"}\n");
      local_2a0._M_dataplus._M_p._0_4_ = (int)local_2a0._M_dataplus._M_p + 1;
    }
    if (local_2c8->num_weak_fields_ != 0) {
      Formatter::operator()<>(&local_228,"_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
    }
    if (0 < *(int *)(local_2c8->descriptor_ + 0x78)) {
      Formatter::operator()<>
                (&local_228,
                 "_extensions_.MergeFrom(internal_default_instance(), from._extensions_);\n");
    }
    Formatter::operator()<>
              (&local_228,
               "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n");
    io::Printer::Outdent(local_228.printer_);
    Formatter::operator()<>(&local_228,"}\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1a0.variables_._M_t);
    std::
    vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
    ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)(local_270 + 0x28));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_228.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeFrom(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the GOOGLE_CHECK and cast.
  Formatter format(printer, variables_);
  format(
      "void $classname$::MergeFrom(const $classname$& from) {\n"
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n"
      "  $DCHK$_NE(&from, this);\n");
  format.Indent();

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b);
      });

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);

  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    bool have_outer_if =
        chunk.size() > 1 && HasByteIndex(chunk.front()) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "from.",
                              printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = from._has_bits_[$1$];\n",
               cached_has_word_index);
      }

      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit merging code for each of the fields we processed.
    bool deferred_has_bit_changes = false;
    for (const auto field : chunk) {
      const FieldGenerator& generator = field_generators_.get(field);

      if (field->is_repeated()) {
        generator.GenerateMergingCode(printer);
      } else if (field->is_optional() && !HasHasbit(field)) {
        // Merge semantics without true field presence: primitive fields are
        // merged only if non-zero (numeric) or non-empty (string).
        bool have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "from.", field);
        generator.GenerateMergingCode(printer);
        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      } else if (field->options().weak() ||
                 cached_has_word_index != HasWordIndex(field)) {
        // Check hasbit, not using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        format("if (from._internal_has_$1$()) {\n", FieldName(field));
        format.Indent();
        generator.GenerateMergingCode(printer);
        format.Outdent();
        format("}\n");
      } else {
        // Check hasbit, using cached bits.
        GOOGLE_CHECK(HasHasbit(field));
        int has_bit_index = has_bit_indices_[field->index()];
        const std::string mask = StrCat(
            strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
        format("if (cached_has_bits & 0x$1$u) {\n", mask);
        format.Indent();

        if (have_outer_if && IsPOD(field)) {
          // Defer hasbit modification until the end of chunk.
          // This can reduce the number of loads/stores by up to 7 per 8 fields.
          deferred_has_bit_changes = true;
          generator.GenerateCopyConstructorCode(printer);
        } else {
          generator.GenerateMergingCode(printer);
        }

        format.Outdent();
        format("}\n");
      }
    }

    if (have_outer_if) {
      if (deferred_has_bit_changes) {
        // Flush the has bits for the primitives we deferred.
        GOOGLE_CHECK_LE(0, cached_has_word_index);
        format("_has_bits_[$1$] |= cached_has_bits;\n", cached_has_word_index);
      }

      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch (from.$1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateMergingCode(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }
  if (num_weak_fields_) {
    format("_weak_field_map_.MergeFrom(from._weak_field_map_);\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    format(
        "_extensions_.MergeFrom(internal_default_instance(), "
        "from._extensions_);\n");
  }

  format(
      "_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}